

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O3

void __thiscall
COLLADAFW::
ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
::reallocMemory(ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                *this,size_t minCapacity)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **pppVar1;
  ulong uVar2;
  
  if (this->mCapacity < minCapacity) {
    uVar2 = (this->mCapacity * 3 >> 1) + 1;
    if (uVar2 <= minCapacity) {
      uVar2 = minCapacity;
    }
    this->mCapacity = uVar2;
    if (this->mData ==
        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         **)0x0) {
      pppVar1 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 **)malloc(uVar2 * 8);
      this->mData = pppVar1;
      this->mCount = 0;
      this->mCapacity = uVar2;
    }
    else {
      pppVar1 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 **)realloc(this->mData,uVar2 * 8);
      this->mData = pppVar1;
      if (this->mCapacity < this->mCount) {
        this->mCount = this->mCapacity;
      }
    }
  }
  return;
}

Assistant:

void reallocMemory ( size_t minCapacity )
		{
			if ( minCapacity <= mCapacity)
				return;
			size_t newCapacity = ( mCapacity * 3 ) / 2 + 1;
			if (newCapacity < minCapacity)
				newCapacity = minCapacity;
			mCapacity = newCapacity;

			if ( mData )
			{
				mData = ( Type* ) realloc ( mData, mCapacity * sizeof ( Type ) );
				if ( mCount > mCapacity )
					mCount = mCapacity;
			}
			else
			{
				allocMemory(newCapacity, mFlags);
			}
		}